

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztrnsform.cpp
# Opt level: O2

void __thiscall TPZTransform<Fad<double>_>::TPZTransform(TPZTransform<Fad<double>_> *this,int dim)

{
  Fad<double> *this_00;
  long row;
  ulong row_00;
  ulong uVar1;
  Fad<double> local_50;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZTransform_016a30a0;
  local_50.val_ = 0.0;
  local_50.dx_.num_elts = 0;
  row = (long)dim;
  local_50.dx_.ptr_to_data = (double *)0x0;
  local_50.defaultVal = 0.0;
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&this->fMult,row,row,&local_50);
  Vector<double>::destroy(&local_50.dx_);
  local_50.val_ = 0.0;
  local_50.dx_.num_elts = 0;
  local_50.dx_.ptr_to_data = (double *)0x0;
  local_50.defaultVal = 0.0;
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix(&this->fSum,row,1,&local_50);
  Vector<double>::destroy(&local_50.dx_);
  this->fRow = dim;
  this->fCol = dim;
  row_00 = 0;
  memset((this->fMult).super_TPZFMatrix<Fad<double>_>.fElem,0,
         (this->fMult).super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
         super_TPZBaseMatrix.fRow *
         (this->fMult).super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
         super_TPZBaseMatrix.fCol * 0x20);
  (this->fMult).super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDecomposed = '\0';
  memset((this->fSum).super_TPZFMatrix<Fad<double>_>.fElem,0,
         (this->fSum).super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
         super_TPZBaseMatrix.fRow *
         (this->fSum).super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
         super_TPZBaseMatrix.fCol * 0x20);
  (this->fSum).super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDecomposed = '\0';
  uVar1 = (ulong)(uint)dim;
  if (dim < 1) {
    uVar1 = row_00;
  }
  for (; uVar1 != row_00; row_00 = row_00 + 1) {
    local_50.val_ = 1.0;
    this_00 = TPZFMatrix<Fad<double>_>::operator()
                        (&(this->fMult).super_TPZFMatrix<Fad<double>_>,row_00,row_00);
    Fad<double>::operator=<double,_nullptr>(this_00,&local_50.val_);
  }
  return;
}

Assistant:

TPZTransform<T>::TPZTransform(int dim) :
fMult(dim,dim,0.), fSum(dim,1,0.) {
	fRow = dim;
	fCol = dim;
	fMult.Zero();
	fSum.Zero();
	int d;
	
	for(d=0; d<dim; d++) {
		fMult(d,d) = 1.;
	}
	
}